

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O2

void VP8IteratorExport(VP8EncIterator *it)

{
  int iVar1;
  WebPPicture *pWVar2;
  int iVar3;
  uint8_t *__src;
  int iVar4;
  int iVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint8_t *__dest;
  size_t __n;
  int iVar8;
  uint8_t *__src_00;
  uint8_t *puVar9;
  
  if (it->enc->config->show_compressed != 0) {
    iVar5 = it->x;
    iVar8 = it->y;
    puVar9 = it->yuv_out;
    pWVar2 = it->enc->pic;
    iVar1 = pWVar2->y_stride;
    __dest = pWVar2->y + (iVar1 * iVar8 + iVar5) * 0x10;
    __src_00 = puVar9 + 0x10;
    puVar6 = pWVar2->u;
    iVar3 = (pWVar2->uv_stride * iVar8 + iVar5) * 8;
    iVar5 = pWVar2->width + iVar5 * -0x10;
    iVar8 = pWVar2->height + iVar8 * -0x10;
    if (0xf < iVar5) {
      iVar5 = 0x10;
    }
    if (0xf < iVar8) {
      iVar8 = 0x10;
    }
    puVar7 = pWVar2->v;
    __src = puVar9;
    for (iVar4 = iVar8; 0 < iVar4; iVar4 = iVar4 + -1) {
      memcpy(__dest,__src,(long)iVar5);
      __dest = __dest + iVar1;
      __src = __src + 0x20;
    }
    puVar6 = puVar6 + iVar3;
    iVar1 = pWVar2->uv_stride;
    __n = (size_t)(iVar5 + 1 >> 1);
    iVar8 = iVar8 + 1 >> 1;
    for (iVar5 = iVar8; 0 < iVar5; iVar5 = iVar5 + -1) {
      memcpy(puVar6,__src_00,__n);
      puVar6 = puVar6 + iVar1;
      __src_00 = __src_00 + 0x20;
    }
    puVar9 = puVar9 + 0x18;
    puVar7 = puVar7 + iVar3;
    iVar5 = pWVar2->uv_stride;
    for (; 0 < iVar8; iVar8 = iVar8 + -1) {
      memcpy(puVar7,puVar9,__n);
      puVar7 = puVar7 + iVar5;
      puVar9 = puVar9 + 0x20;
    }
  }
  return;
}

Assistant:

void VP8IteratorExport(const VP8EncIterator* const it) {
  const VP8Encoder* const enc = it->enc;
  if (enc->config->show_compressed) {
    const int x = it->x, y = it->y;
    const uint8_t* const ysrc = it->yuv_out + Y_OFF_ENC;
    const uint8_t* const usrc = it->yuv_out + U_OFF_ENC;
    const uint8_t* const vsrc = it->yuv_out + V_OFF_ENC;
    const WebPPicture* const pic = enc->pic;
    uint8_t* const ydst = pic->y + (y * pic->y_stride + x) * 16;
    uint8_t* const udst = pic->u + (y * pic->uv_stride + x) * 8;
    uint8_t* const vdst = pic->v + (y * pic->uv_stride + x) * 8;
    int w = (pic->width - x * 16);
    int h = (pic->height - y * 16);

    if (w > 16) w = 16;
    if (h > 16) h = 16;

    // Luma plane
    ExportBlock(ysrc, ydst, pic->y_stride, w, h);

    {   // U/V planes
      const int uv_w = (w + 1) >> 1;
      const int uv_h = (h + 1) >> 1;
      ExportBlock(usrc, udst, pic->uv_stride, uv_w, uv_h);
      ExportBlock(vsrc, vdst, pic->uv_stride, uv_w, uv_h);
    }
  }
}